

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O3

void __thiscall QMessageLogger::debug(QMessageLogger *this,char *msg,...)

{
  char in_AL;
  int frameCount;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_228 [16];
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined4 local_1f8;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  __va_list_tag local_178;
  QInternalMessageLogContext local_160;
  long local_20;
  
  if (in_AL != '\0') {
    local_1f8 = in_XMM0_Da;
    local_1e8 = in_XMM1_Qa;
    local_1d8 = in_XMM2_Qa;
    local_1c8 = in_XMM3_Qa;
    local_1b8 = in_XMM4_Qa;
    local_1a8 = in_XMM5_Qa;
    local_198 = in_XMM6_Qa;
    local_188 = in_XMM7_Qa;
  }
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_218 = in_RDX;
  local_210 = in_RCX;
  local_208 = in_R8;
  local_200 = in_R9;
  memset(&local_160.backtrace,0xaa,0x120);
  local_160.super_QMessageLogContext.version = 2;
  local_160.super_QMessageLogContext._4_8_ = 0;
  local_160.super_QMessageLogContext.file._4_4_ = 0;
  local_160.super_QMessageLogContext.function._0_4_ = 0;
  local_160.super_QMessageLogContext.function._4_4_ = 0;
  local_160.super_QMessageLogContext.category = (char *)0x0;
  local_160.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
  super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
  super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged = false;
  frameCount = QInternalMessageLogContext::initFrom(&local_160,&this->context);
  if (frameCount != 0) {
    QInternalMessageLogContext::populateBacktrace(&local_160,frameCount);
  }
  local_178.gp_offset = 0x10;
  local_178.fp_offset = 0x30;
  local_178.overflow_arg_area = &stack0x00000008;
  local_178.reg_save_area = auStack_228;
  qt_message(QtDebugMsg,&local_160.super_QMessageLogContext,msg,&local_178);
  if (local_160.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>.
      _M_payload.super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
      super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged == true) {
    local_160.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload
    .super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
    super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged = false;
    if ((undefined1 *)
        local_160.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>.
        _M_payload.super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
        super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload._M_value.
        super_QVLABase<void_*>.super_QVLABaseBase.ptr !=
        (undefined1 *)
        ((long)&local_160.backtrace.
                super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
                super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
                super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_> + 0x18U)) {
      QtPrivate::sizedFree
                (local_160.backtrace.
                 super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
                 super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
                 super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload._M_value.
                 super_QVLABase<void_*>.super_QVLABaseBase.ptr,
                 local_160.backtrace.
                 super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
                 super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
                 super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload._M_value.
                 super_QVLABase<void_*>.super_QVLABaseBase.a << 3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageLogger::debug(const char *msg, ...) const
{
    QInternalMessageLogContext ctxt(context);
    va_list ap;
    va_start(ap, msg); // use variable arg list
    qt_message(QtDebugMsg, ctxt, msg, ap);
    va_end(ap);
}